

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O2

string * __thiscall
pbrt::MLTSampler::PrimarySample::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PrimarySample *this)

{
  long *in_R9;
  
  StringPrintf<long_const&,float_const&,long_const&>
            (__return_storage_ptr__,
             (pbrt *)
             "[ PrimarySample lastModificationIteration: %d valueBackup: %f modifyBackup: %d ]",
             (char *)&this->lastModificationIteration,(long *)&this->valueBackup,
             (float *)&this->modifyBackup,in_R9);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const {
            return StringPrintf("[ PrimarySample lastModificationIteration: %d "
                                "valueBackup: %f modifyBackup: %d ]",
                                lastModificationIteration, valueBackup, modifyBackup);
        }